

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.h
# Opt level: O0

uint64 Hash128to64(uint128 *x)

{
  uint64 uVar1;
  uint64 uVar2;
  ulong uVar3;
  uint128 *in_RDI;
  uint64 b;
  uint64 a;
  uint64 kMul;
  
  uVar1 = Uint128Low64(in_RDI);
  uVar2 = Uint128High64(in_RDI);
  uVar3 = (uVar1 ^ uVar2) * -0x622015f714c7d297;
  uVar1 = Uint128High64(in_RDI);
  uVar3 = (uVar1 ^ uVar3 >> 0x2f ^ uVar3) * -0x622015f714c7d297;
  return (uVar3 >> 0x2f ^ uVar3) * -0x622015f714c7d297;
}

Assistant:

inline uint64 Hash128to64(const uint128& x) {
  // Murmur-inspired hashing.
  const uint64 kMul = 0x9ddfea08eb382d69ULL;
  uint64 a = (Uint128Low64(x) ^ Uint128High64(x)) * kMul;
  a ^= (a >> 47);
  uint64 b = (Uint128High64(x) ^ a) * kMul;
  b ^= (b >> 47);
  b *= kMul;
  return b;
}